

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void __thiscall sf::Text::setOutlineColor(Text *this,Color *color)

{
  bool bVar1;
  size_t sVar2;
  Vertex *pVVar3;
  size_t sVar4;
  VertexArray *this_00;
  
  bVar1 = operator!=(color,&this->m_outlineColor);
  if ((bVar1) && (this->m_outlineColor = *color, this->m_geometryNeedUpdate == false)) {
    this_00 = &this->m_outlineVertices;
    sVar2 = VertexArray::getVertexCount(this_00);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        pVVar3 = VertexArray::operator[](this_00,sVar2);
        pVVar3->color = this->m_outlineColor;
        sVar2 = sVar2 + 1;
        sVar4 = VertexArray::getVertexCount(this_00);
      } while (sVar2 < sVar4);
    }
  }
  return;
}

Assistant:

void Text::setOutlineColor(const Color& color)
{
    if (color != m_outlineColor)
    {
        m_outlineColor = color;

        // Change vertex colors directly, no need to update whole geometry
        // (if geometry is updated anyway, we can skip this step)
        if (!m_geometryNeedUpdate)
        {
            for (std::size_t i = 0; i < m_outlineVertices.getVertexCount(); ++i)
                m_outlineVertices[i].color = m_outlineColor;
        }
    }
}